

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O2

MoveFull * __thiscall
banksia::BoardCore::createFullMove
          (MoveFull *__return_storage_ptr__,BoardCore *this,int from,int dest,PieceType promotion)

{
  int iVar1;
  Piece PVar2;
  
  (__return_storage_ptr__->super_Move).from = from;
  (__return_storage_ptr__->super_Move).dest = dest;
  (__return_storage_ptr__->super_Move).promotion = promotion;
  iVar1 = (*(this->super_Obj)._vptr_Obj[6])(this,(ulong)(uint)from);
  if ((char)iVar1 != '\0') {
    PVar2 = getPiece(this,from);
    __return_storage_ptr__->piece = PVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

MoveFull BoardCore::createFullMove(int from, int dest, PieceType promotion) const
{
    MoveFull move(from, dest, promotion);
    if (isPositionValid(from)) {
        move.piece = getPiece(from);
    }
    return move;
}